

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2StartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  xmlParserCtxtPtr ctxt;
  xmlChar **atts_local;
  xmlChar *fullname_local;
  void *ctx_local;
  
  if (((ctx != (void *)0x0) && (fullname != (xmlChar *)0x0)) && (*(long *)((long)ctx + 0x10) != 0))
  {
    if (*(int *)((long)ctx + 0x34) == 0) {
      xmlSAX1StartElement(ctx,fullname,atts);
    }
    else if (*(int *)((long)ctx + 0x34) != 0) {
      xmlSAX2StartHtmlElement((xmlParserCtxtPtr)ctx,fullname,atts);
    }
  }
  return;
}

Assistant:

void
xmlSAX2StartElement(void *ctx, const xmlChar *fullname, const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    (void) atts;

    if ((ctxt == NULL) || (fullname == NULL) || (ctxt->myDoc == NULL))
        return;

#ifdef LIBXML_SAX1_ENABLED
    if (!ctxt->html) {
        xmlSAX1StartElement(ctxt, fullname, atts);
        return;
    }
#endif

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        xmlSAX2StartHtmlElement(ctxt, fullname, atts);
        return;
    }
#endif
}